

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O1

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - manage PF_CAN netlink gateway.\n",prg);
  fprintf(_stderr,"\nUsage: %s [options]\n\n",prg);
  fwrite("Commands:\n",10,1,_stderr);
  fwrite("          -A  (add a new rule)\n",0x1f,1,_stderr);
  fwrite("          -D  (delete a rule)\n",0x1e,1,_stderr);
  fwrite("          -F  (flush / delete all rules)\n",0x29,1,_stderr);
  fwrite("          -L  (list all rules)\n",0x1f,1,_stderr);
  fwrite("Mandatory:\n",0xb,1,_stderr);
  fwrite("          -s <src_dev>  (source netdevice)\n",0x2b,1,_stderr);
  fwrite("          -d <dst_dev>  (destination netdevice)\n",0x30,1,_stderr);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("          -X  (this is a CAN FD rule)\n",0x26,1,_stderr);
  fwrite("          -t  (preserve src_dev rx timestamp)\n",0x2e,1,_stderr);
  fwrite("          -e  (echo sent frames - recommended on vcanx)\n",0x38,1,_stderr);
  fwrite("          -i  (allow to route to incoming interface)\n",0x35,1,_stderr);
  fwrite("          -u <uid>  (user defined modification identifier)\n",0x3b,1,_stderr);
  fwrite("          -l <hops>  (limit the number of frame hops / routings)\n",0x41,1,_stderr);
  fwrite("          -f <filter>  (set CAN filter)\n",0x28,1,_stderr);
  fwrite("          -m <mod>  (set Classical CAN frame modifications)\n",0x3c,1,_stderr);
  fwrite("          -M <MOD>  (set CAN FD frame modifications)\n",0x35,1,_stderr);
  fwrite("          -x <from_idx>:<to_idx>:<result_idx>:<init_xor_val>  (XOR checksum)\n",0x4d,1,
         _stderr);
  fwrite("          -c <from>:<to>:<result>:<init_val>:<xor_val>:<crctab[256]>  (CRC8 cs)\n",0x50,1,
         _stderr);
  fwrite("          -p <profile>:[<profile_data>]  (CRC8 checksum profile & parameters)\n",0x4e,1,
         _stderr);
  fwrite("\nValues are given and expected in hexadecimal values. Leading 0s can be omitted.\n",0x51,
         1,_stderr);
  fputc(10,_stderr);
  fwrite("<filter> is a <value><mask> CAN identifier filter:\n",0x33,1,_stderr);
  fwrite("  <can_id>:<can_mask>  (matches when <received_can_id> & mask == can_id & mask)\n",0x50,1,
         _stderr);
  fwrite("  <can_id>~<can_mask>  (matches when <received_can_id> & mask != can_id & mask)\n",0x50,1,
         _stderr);
  fputc(10,_stderr);
  fwrite("<mod> is a Classical CAN frame modification instruction consisting of\n",0x46,1,_stderr);
  fwrite("<instruction>:<can_frame-elements>:<can_id>.<can_dlc>.<can_data>\n",0x41,1,_stderr);
  fwrite("  <instruction>  is one of \'AND\' \'OR\' \'XOR\' \'SET\'\n",0x32,1,_stderr);
  fwrite("  <can_frame-elements>  is _one_ or _more_ of \'I\'dentifier \'L\'ength \'D\'ata\n",0x4b,1
         ,_stderr);
  fwrite("  <can_id>  is an u32 value containing the CAN Identifier\n",0x3a,1,_stderr);
  fwrite("  <can_dlc>  is an u8 value containing the data length code in hex (0 .. F)\n",0x4c,1,
         _stderr);
  fwrite("  <can_data>  is always eight(!) u8 values containing the CAN frames data\n",0x4a,1,
         _stderr);
  fputc(10,_stderr);
  fwrite("<MOD> is a CAN FD frame modification instruction consisting of\n",0x3f,1,_stderr);
  fwrite("<instruction>:<canfd_frame-elements>:<can_id>.<flags>.<len>.<can_data>\n",0x47,1,_stderr);
  fwrite("  <instruction>  is one of \'AND\' \'OR\' \'XOR\' \'SET\'\n",0x32,1,_stderr);
  fwrite("  <canfd_frame-elements>  is _one_ or _more_ of \'I\'d \'F\'lags \'L\'ength \'D\'ata\n",
         0x4d,1,_stderr);
  fwrite("  <can_id>  is an u32 value containing the CAN FD Identifier\n",0x3d,1,_stderr);
  fwrite("  <flags>  is an u8 value containing CAN FD flags (CANFD_BRS, CANFD_ESI)\n",0x49,1,_stderr
        );
  fwrite("  <len>  is an u8 value containing the data length in hex (0 .. 40)\n",0x44,1,_stderr);
  fwrite("  <can_data>  is always 64(!) u8 values containing the CAN FD frames data\n",0x4a,1,
         _stderr);
  fwrite("The max. four modifications are performed in the order AND -> OR -> XOR -> SET\n",0x4f,1,
         _stderr);
  fputc(10,_stderr);
  fwrite("Supported CRC 8 profiles:\n",0x1a,1,_stderr);
  fprintf(_stderr," Profile \'%d\' (1U8)        add one additional u8 value\n",1);
  fprintf(_stderr,
          " Profile \'%d\' (16U8)       add u8 value from table[16] indexed by (data[1] & 0xF)\n",2)
  ;
  fprintf(_stderr,
          " Profile \'%d\' (SFFID_XOR)  add u8 value (can_id & 0xFF) ^ (can_id >> 8 & 0xFF)\n",3);
  fputc(10,_stderr);
  fwrite("Examples:\n",10,1,_stderr);
  fprintf(_stderr,"%s -A -s can0 -d vcan3 -e -f 123:C00007FF -m SET:IL:333.4.1122334455667788\n",prg
         );
  fputc(10,_stderr);
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - manage PF_CAN netlink gateway.\n", prg);
	fprintf(stderr, "\nUsage: %s [options]\n\n", prg);
	fprintf(stderr, "Commands:\n");
	fprintf(stderr, "          -A  (add a new rule)\n");
	fprintf(stderr, "          -D  (delete a rule)\n");
	fprintf(stderr, "          -F  (flush / delete all rules)\n");
	fprintf(stderr, "          -L  (list all rules)\n");
	fprintf(stderr, "Mandatory:\n");
	fprintf(stderr, "          -s <src_dev>  (source netdevice)\n");
	fprintf(stderr, "          -d <dst_dev>  (destination netdevice)\n");
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "          -X  (this is a CAN FD rule)\n");
	fprintf(stderr, "          -t  (preserve src_dev rx timestamp)\n");
	fprintf(stderr, "          -e  (echo sent frames - recommended on vcanx)\n");
	fprintf(stderr, "          -i  (allow to route to incoming interface)\n");
	fprintf(stderr, "          -u <uid>  (user defined modification identifier)\n");
	fprintf(stderr, "          -l <hops>  (limit the number of frame hops / routings)\n");
	fprintf(stderr, "          -f <filter>  (set CAN filter)\n");
	fprintf(stderr, "          -m <mod>  (set Classical CAN frame modifications)\n");
	fprintf(stderr, "          -M <MOD>  (set CAN FD frame modifications)\n");
	fprintf(stderr, "          -x <from_idx>:<to_idx>:<result_idx>:<init_xor_val>  (XOR checksum)\n");
	fprintf(stderr, "          -c <from>:<to>:<result>:<init_val>:<xor_val>:<crctab[256]>  (CRC8 cs)\n");
	fprintf(stderr, "          -p <profile>:[<profile_data>]  (CRC8 checksum profile & parameters)\n");
	fprintf(stderr, "\nValues are given and expected in hexadecimal values. Leading 0s can be omitted.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<filter> is a <value><mask> CAN identifier filter:\n");
	fprintf(stderr, "  <can_id>:<can_mask>  (matches when <received_can_id> & mask == can_id & mask)\n");
	fprintf(stderr, "  <can_id>~<can_mask>  (matches when <received_can_id> & mask != can_id & mask)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<mod> is a Classical CAN frame modification instruction consisting of\n");
	fprintf(stderr, "<instruction>:<can_frame-elements>:<can_id>.<can_dlc>.<can_data>\n");
	fprintf(stderr, "  <instruction>  is one of 'AND' 'OR' 'XOR' 'SET'\n");
	fprintf(stderr, "  <can_frame-elements>  is _one_ or _more_ of 'I'dentifier 'L'ength 'D'ata\n");
	fprintf(stderr, "  <can_id>  is an u32 value containing the CAN Identifier\n");
	fprintf(stderr, "  <can_dlc>  is an u8 value containing the data length code in hex (0 .. F)\n");
	fprintf(stderr, "  <can_data>  is always eight(!) u8 values containing the CAN frames data\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<MOD> is a CAN FD frame modification instruction consisting of\n");
	fprintf(stderr, "<instruction>:<canfd_frame-elements>:<can_id>.<flags>.<len>.<can_data>\n");
	fprintf(stderr, "  <instruction>  is one of 'AND' 'OR' 'XOR' 'SET'\n");
	fprintf(stderr, "  <canfd_frame-elements>  is _one_ or _more_ of 'I'd 'F'lags 'L'ength 'D'ata\n");
	fprintf(stderr, "  <can_id>  is an u32 value containing the CAN FD Identifier\n");
	fprintf(stderr, "  <flags>  is an u8 value containing CAN FD flags (CANFD_BRS, CANFD_ESI)\n");
	fprintf(stderr, "  <len>  is an u8 value containing the data length in hex (0 .. 40)\n");
	fprintf(stderr, "  <can_data>  is always 64(!) u8 values containing the CAN FD frames data\n");
	fprintf(stderr, "The max. four modifications are performed in the order AND -> OR -> XOR -> SET\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "Supported CRC 8 profiles:\n");
	fprintf(stderr, " Profile '%d' (1U8)        add one additional u8 value\n", CGW_CRC8PRF_1U8);
	fprintf(stderr, " Profile '%d' (16U8)       add u8 value from table[16] indexed by (data[1] & 0xF)\n", CGW_CRC8PRF_16U8);
	fprintf(stderr, " Profile '%d' (SFFID_XOR)  add u8 value (can_id & 0xFF) ^ (can_id >> 8 & 0xFF)\n", CGW_CRC8PRF_SFFID_XOR);
	fprintf(stderr, "\n");
	fprintf(stderr, "Examples:\n");
	fprintf(stderr, "%s -A -s can0 -d vcan3 -e -f 123:C00007FF -m SET:IL:333.4.1122334455667788\n", prg);
	fprintf(stderr, "\n");
}